

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall
t_c_glib_generator::generate_serialize_struct
          (t_c_glib_generator *this,ostream *out,t_struct *tstruct,string *prefix,int error_ret)

{
  ostream *poVar1;
  string sStack_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"if ((ret = thrift_struct_write (THRIFT_STRUCT (");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"), protocol, error)) < 0)");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,"  return ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,error_ret);
  poVar1 = std::operator<<(poVar1,";");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_88,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_88);
  poVar1 = std::operator<<(poVar1,"xfer += ret;");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_struct(ostream& out,
                                                   t_struct* tstruct,
                                                   string prefix,
                                                   int error_ret) {
  (void)tstruct;
  out << indent() << "if ((ret = thrift_struct_write (THRIFT_STRUCT (" << prefix
      << "), protocol, error)) < 0)" << endl << indent() << "  return " << error_ret << ";" << endl
      << indent() << "xfer += ret;" << endl << endl;
}